

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O0

string * __thiscall
t_markdown_generator::str_to_id(string *__return_storage_ptr__,t_markdown_generator *this,string *s)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator chr;
  string *s_local;
  t_markdown_generator *this_local;
  string *id;
  
  chr._M_current._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_38._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator<=(&local_30,&local_38);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    if ((*pcVar3 != '.') &&
       (pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_30), *pcVar3 != '\0')) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_30);
      iVar2 = tolower((int)*pcVar3);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_markdown_generator::str_to_id(const std::string& s) {
  std::string id;
  for(auto chr=s.begin();chr<=s.end(); ++chr) {
    if(*chr == '.' || *chr == 0)
      continue;
    id += tolower(*chr); 
  }
  return id;
}